

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O0

uint BytesFromDevFmt(DevFmtType type)

{
  DevFmtType type_local;
  uint local_4;
  
  switch(type) {
  case DevFmtByte:
    local_4 = 1;
    break;
  case DevFmtUByte:
    local_4 = 1;
    break;
  case DevFmtShort:
    local_4 = 2;
    break;
  case DevFmtUShort:
    local_4 = 2;
    break;
  case DevFmtInt:
    local_4 = 4;
    break;
  case DevFmtUInt:
    local_4 = 4;
    break;
  case DevFmtFloat:
    local_4 = 4;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint BytesFromDevFmt(DevFmtType type) noexcept
{
    switch(type)
    {
    case DevFmtByte: return sizeof(int8_t);
    case DevFmtUByte: return sizeof(uint8_t);
    case DevFmtShort: return sizeof(int16_t);
    case DevFmtUShort: return sizeof(uint16_t);
    case DevFmtInt: return sizeof(int32_t);
    case DevFmtUInt: return sizeof(uint32_t);
    case DevFmtFloat: return sizeof(float);
    }
    return 0;
}